

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O0

void DNA::print(Base *dna,size_t dna_size)

{
  undefined4 uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_18;
  size_t dna_size_local;
  Base *dna_local;
  
  local_18 = dna_size;
  dna_size_local = (size_t)dna;
  while (sVar2 = local_18 - 1, local_18 != 0) {
    sVar3 = dna_size_local + 4;
    uVar1 = *(undefined4 *)dna_size_local;
    local_18 = sVar2;
    dna_size_local = sVar3;
    switch(uVar1) {
    case 0:
      putc(0x41,_stdout);
      break;
    case 1:
      putc(0x43,_stdout);
      break;
    case 2:
      putc(0x47,_stdout);
      break;
    case 3:
      putc(0x54,_stdout);
    }
  }
  return;
}

Assistant:

void DNA::print(const DNA::Base* dna, size_t dna_size)
{
    while (dna_size--) {
        switch (*dna++) {
             case DNA::A:
                 std::putc('A', stdout);
                 break;
             case DNA::C:
                 std::putc('C', stdout);
                 break;
             case DNA::G:
                 std::putc('G', stdout);
                 break;
             case DNA::T:
                 std::putc('T', stdout);
                 break;
        }
    }
}